

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_vote.cxx
# Opt level: O0

void __thiscall nuraft::raft_server::initiate_vote(raft_server *this,bool force_vote)

{
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  int32 iVar4;
  srv_role sVar5;
  element_type *peVar6;
  __int_type _Var7;
  __int_type _Var8;
  timer_helper *ptVar9;
  undefined8 *puVar10;
  element_type *peVar11;
  uint64_t uVar12;
  byte in_SIL;
  long in_RDI;
  bool in_stack_000000d7;
  raft_server *in_stack_000000d8;
  ulong cur_term;
  int grace_period;
  memory_order __b_2;
  memory_order __b_1;
  memory_order __b;
  undefined4 in_stack_fffffffffffffe48;
  srv_role in_stack_fffffffffffffe4c;
  undefined1 __i;
  timer_helper *in_stack_fffffffffffffe50;
  __atomic_base<unsigned_long> *in_stack_fffffffffffffe58;
  timer_helper *in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe6c;
  raft_server *in_stack_fffffffffffffe78;
  timer_helper *in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe98;
  srv_role in_stack_fffffffffffffe9c;
  undefined1 local_100 [64];
  string local_c0 [48];
  string local_90 [32];
  timer_helper *local_70;
  srv_role local_58;
  byte local_51;
  undefined8 local_48;
  memory_order local_40;
  int local_3c;
  undefined8 *local_38;
  undefined8 local_30;
  memory_order local_28;
  int local_24;
  undefined8 *local_20;
  undefined8 local_18;
  memory_order local_10;
  int local_c;
  undefined8 *local_8;
  
  local_51 = in_SIL & 1;
  std::unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_>::operator->
            ((unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_> *)0x29ac27);
  nuraft::context::get_params
            ((context *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
  peVar6 = std::__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x29ac44);
  sVar5 = peVar6->grace_period_of_lagging_state_machine_;
  std::shared_ptr<nuraft::raft_params>::~shared_ptr((shared_ptr<nuraft::raft_params> *)0x29ac5b);
  local_58 = sVar5;
  std::__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x29ac7d);
  local_70 = (timer_helper *)srv_state::get_term((srv_state *)0x29ac85);
  if (((local_51 & 1) == 0) && (local_58 != 0)) {
    _Var7 = std::__atomic_base::operator_cast_to_unsigned_long(in_stack_fffffffffffffe58);
    _Var8 = std::__atomic_base::operator_cast_to_unsigned_long(in_stack_fffffffffffffe58);
    if (_Var7 < _Var8) {
      bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
      if (bVar2) {
        peVar11 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x29ad1e);
        iVar3 = (*peVar11->_vptr_logger[7])();
        if (3 < iVar3) {
          peVar11 = std::
                    __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                    operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x29ad44);
          puVar10 = (undefined8 *)(in_RDI + 0xa8);
          local_c = 5;
          local_8 = puVar10;
          local_10 = std::operator&(memory_order_seq_cst,__memory_order_mask);
          if (local_c - 1U < 2) {
            local_18 = *puVar10;
          }
          else if (local_c == 5) {
            local_18 = *puVar10;
          }
          else {
            local_18 = *puVar10;
          }
          uVar1 = local_18;
          puVar10 = (undefined8 *)(in_RDI + 0xb0);
          local_24 = 5;
          local_20 = puVar10;
          local_28 = std::operator&(memory_order_seq_cst,__memory_order_mask);
          if (local_24 - 1U < 2) {
            local_30 = *puVar10;
          }
          else if (local_24 == 5) {
            local_30 = *puVar10;
          }
          else {
            local_30 = *puVar10;
          }
          msg_if_given_abi_cxx11_
                    ((char *)local_90,
                     "grace period option is enabled, and state machine needs catch-up: %lu vs. %lu"
                     ,uVar1,local_30);
          (*peVar11->_vptr_logger[8])
                    (peVar11,4,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_vote.cxx"
                     ,"initiate_vote",0xae,local_90);
          std::__cxx11::string::~string(local_90);
        }
      }
      ptVar9 = (timer_helper *)
               std::__atomic_base::operator_cast_to_unsigned_long(in_stack_fffffffffffffe58);
      if (ptVar9 != local_70) {
        bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
        if (bVar2) {
          peVar11 = std::
                    __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                    operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x29af87);
          iVar3 = (*peVar11->_vptr_logger[7])();
          if (3 < iVar3) {
            in_stack_fffffffffffffe90 =
                 (timer_helper *)
                 std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x29afad);
            puVar10 = (undefined8 *)(in_RDI + 0x6c0);
            local_3c = 5;
            in_stack_fffffffffffffe9c = local_58;
            local_38 = puVar10;
            local_40 = std::operator&(memory_order_seq_cst,__memory_order_mask);
            if (local_3c - 1U < 2) {
              local_48 = *puVar10;
            }
            else if (local_3c == 5) {
              local_48 = *puVar10;
            }
            else {
              local_48 = *puVar10;
            }
            msg_if_given_abi_cxx11_
                      ((char *)local_c0,
                       "grace period: %d, term increment detected %lu vs. %lu, reset timer",
                       (ulong)in_stack_fffffffffffffe9c,local_48,local_70);
            (*((_func_int **)(in_stack_fffffffffffffe90->t_created_).__d.__r)[8])
                      (in_stack_fffffffffffffe90,4,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_vote.cxx"
                       ,"initiate_vote",0xb2,local_c0);
            std::__cxx11::string::~string(local_c0);
          }
        }
        timer_helper::set_duration_ms
                  (in_stack_fffffffffffffe50,
                   CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
        timer_helper::reset(in_stack_fffffffffffffe60);
        std::__atomic_base<unsigned_long>::operator=
                  ((__atomic_base<unsigned_long> *)in_stack_fffffffffffffe60,
                   (__int_type)in_stack_fffffffffffffe58);
      }
      ptVar9 = (timer_helper *)
               std::__atomic_base::operator_cast_to_unsigned_long(in_stack_fffffffffffffe58);
      if ((ptVar9 == local_70) &&
         (bVar2 = timer_helper::timeout
                            ((timer_helper *)
                             CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98)), !bVar2)
         ) {
        bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
        if (!bVar2) {
          return;
        }
        peVar11 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x29b1a6);
        iVar3 = (*peVar11->_vptr_logger[7])();
        if (iVar3 < 4) {
          return;
        }
        peVar11 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x29b1cc);
        ptVar9 = local_70;
        sVar5 = local_58;
        uVar12 = timer_helper::get_ms(in_stack_fffffffffffffe90);
        msg_if_given_abi_cxx11_
                  (local_100 + 0x20,
                   "grace period: %d, term %lu, waited %lu ms, skip initiating vote",(ulong)sVar5,
                   ptVar9,uVar12);
        (*peVar11->_vptr_logger[8])
                  (peVar11,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_vote.cxx"
                   ,"initiate_vote",0xbd,local_100 + 0x20);
        std::__cxx11::string::~string((string *)(local_100 + 0x20));
        return;
      }
      bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
      if (bVar2) {
        peVar11 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x29b2bd);
        iVar3 = (*peVar11->_vptr_logger[7])();
        if (3 < iVar3) {
          in_stack_fffffffffffffe58 =
               (__atomic_base<unsigned_long> *)
               std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x29b2e3);
          in_stack_fffffffffffffe4c = local_58;
          in_stack_fffffffffffffe50 = local_70;
          uVar12 = timer_helper::get_ms(in_stack_fffffffffffffe90);
          in_stack_fffffffffffffe60 = (timer_helper *)local_100;
          msg_if_given_abi_cxx11_
                    ((char *)in_stack_fffffffffffffe60,
                     "grace period: %d, no new leader detected for term %lu for %lu ms",
                     (ulong)in_stack_fffffffffffffe4c,in_stack_fffffffffffffe50,uVar12);
          (*((_func_int **)in_stack_fffffffffffffe58->_M_i)[8])
                    (in_stack_fffffffffffffe58,4,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_vote.cxx"
                     ,"initiate_vote",0xc3,in_stack_fffffffffffffe60);
          std::__cxx11::string::~string((string *)local_100);
        }
      }
    }
  }
  if ((((*(int *)(in_RDI + 0x40) <= *(int *)(in_RDI + 0x3c)) || ((local_51 & 1) != 0)) ||
      (bVar2 = check_cond_for_zp_election(in_stack_fffffffffffffe78), bVar2)) ||
     (iVar4 = get_quorum_for_election(in_stack_fffffffffffffe78), iVar4 == 0)) {
    std::__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x29b3f7);
    srv_state::inc_term((srv_state *)in_stack_fffffffffffffe60);
    std::__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x29b413);
    srv_state::set_voted_for((srv_state *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c);
    std::atomic<nuraft::srv_role>::operator=
              ((atomic<nuraft::srv_role> *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c);
    *(undefined4 *)(in_RDI + 0x8c) = 0;
    *(undefined4 *)(in_RDI + 0x88) = 0;
    *(undefined1 *)(in_RDI + 0xe8) = 0;
    request_vote(in_stack_000000d8,in_stack_000000d7);
  }
  __i = (undefined1)(in_stack_fffffffffffffe4c >> 0x18);
  sVar5 = std::atomic::operator_cast_to_srv_role((atomic<nuraft::srv_role> *)0x29b481);
  if (sVar5 != leader) {
    std::atomic<bool>::operator=((atomic<bool> *)in_stack_fffffffffffffe50,(bool)__i);
    std::__atomic_base<int>::operator=
              ((__atomic_base<int> *)in_stack_fffffffffffffe58,
               (__int_type_conflict)((ulong)in_stack_fffffffffffffe50 >> 0x20));
  }
  return;
}

Assistant:

void raft_server::initiate_vote(bool force_vote) {
    int grace_period = ctx_->get_params()->grace_period_of_lagging_state_machine_;
    ulong cur_term = state_->get_term();
    if ( !force_vote &&
         grace_period &&
         sm_commit_index_ < lagging_sm_target_index_ ) {
        p_in("grace period option is enabled, and state machine needs catch-up: "
             "%" PRIu64 " vs. %" PRIu64 "",
             sm_commit_index_.load(),
             lagging_sm_target_index_.load());
        if (vote_init_timer_term_ != cur_term) {
            p_in("grace period: %d, term increment detected %" PRIu64 " vs. %" PRIu64
                 ", reset timer",
                grace_period, vote_init_timer_term_.load(), cur_term);
            vote_init_timer_.set_duration_ms(grace_period);
            vote_init_timer_.reset();
            vote_init_timer_term_ = cur_term;
        }

        if ( vote_init_timer_term_ == cur_term &&
             !vote_init_timer_.timeout() ) {
            // Grace period, do not initiate vote.
            p_in("grace period: %d, term %" PRIu64 ", waited %" PRIu64
                 " ms, skip initiating vote",
                 grace_period, cur_term, vote_init_timer_.get_ms());
            return;

        } else {
            p_in("grace period: %d, no new leader detected for term %" PRIu64
                 " for %" PRIu64 " ms",
                 grace_period, cur_term, vote_init_timer_.get_ms());
        }
    }

    if ( my_priority_ >= target_priority_ ||
         force_vote ||
         check_cond_for_zp_election() ||
         get_quorum_for_election() == 0 ) {
        // Request vote when
        //  1) my priority satisfies the target, OR
        //  2) I'm the only node in the group.
        state_->inc_term();
        state_->set_voted_for(-1);
        role_ = srv_role::candidate;
        votes_granted_ = 0;
        votes_responded_ = 0;
        election_completed_ = false;
        // NOTE: Following `request_vote` will call `save_state()`,
        //       hence we don't call it here even though `state_` changes.
        request_vote(force_vote);
    }

    if (role_ != srv_role::leader) {
        hb_alive_ = false;
        leader_ = -1;
    }
}